

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_> *
__thiscall
Corrade::Utility::String::parseNumberSequence
          (Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_>
           *__return_storage_ptr__,String *this,StringView string,uint32_t min,uint32_t max)

{
  StringView value;
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  Debug *pDVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  ulong i;
  bool bVar10;
  ArrayView<unsigned_int> AVar11;
  StringView value_00;
  uint32_t number;
  char c;
  uint local_8c;
  Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> out;
  StringView string_local;
  Error local_58;
  
  pcVar7 = string._data;
  local_8c = (uint)string._sizePlusFlags;
  out._deleter = (_func_void_uint_ptr_unsigned_long *)0x0;
  number = 0;
  out._data = (uint *)0x0;
  out._size = 0;
  uVar8 = 0xffffffff;
  i = 0;
  bVar10 = false;
  bVar1 = false;
  string_local._data = (char *)this;
  string_local._sizePlusFlags = (size_t)pcVar7;
  do {
    uVar5 = (ulong)pcVar7 & 0x3fffffffffffffff;
    if (uVar5 < i) {
      __return_storage_ptr__->_set = true;
      (__return_storage_ptr__->field_0)._value._data = out._data;
      (__return_storage_ptr__->field_0)._value._size = out._size;
      (__return_storage_ptr__->field_0)._value._deleter = out._deleter;
      out._data = (uint *)0x0;
      out._size = 0;
      out._deleter = (_func_void_uint_ptr_unsigned_long *)0x0;
LAB_0013c04c:
      Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>::~Array(&out);
      return __return_storage_ptr__;
    }
    if (i == uVar5) {
      c = 0;
    }
    else {
      pbVar3 = (byte *)Containers::BasicStringView<const_char>::operator[](&string_local,i);
      c = *pbVar3;
      uVar5 = string_local._sizePlusFlags & 0x3fffffffffffffff;
      pcVar7 = (char *)string_local._sizePlusFlags;
    }
    if ((i == uVar5) ||
       (((byte)c < 0x3c && ((0x800100100003e00U >> ((ulong)(byte)c & 0x3f) & 1) != 0)))) {
      uVar2 = uVar8;
      if (!bVar10) {
        if (uVar8 == 0xffffffff) {
          uVar2 = 0xffffffff;
          if ((bVar1) && (uVar2 = 0xffffffff, number < min && local_8c <= number)) {
            Containers::
            arrayAppend<unsigned_int,Corrade::Containers::ArrayMallocAllocator<unsigned_int>>
                      (&out,&number);
            uVar2 = 0xffffffff;
          }
        }
        else {
          uVar9 = number + 1;
          if (min <= number) {
            uVar9 = min;
          }
          if (!bVar1) {
            uVar9 = min;
          }
          uVar2 = 0xffffffff;
          if (uVar8 < uVar9) {
            AVar11 = Containers::
                     arrayAppend<unsigned_int,Corrade::Containers::ArrayMallocAllocator<unsigned_int>>
                               (&out);
            for (lVar6 = 0; AVar11._size * 4 != lVar6; lVar6 = lVar6 + 4) {
              *(uint *)((long)AVar11._data + lVar6) = uVar8;
              uVar8 = uVar8 + 1;
            }
            uVar2 = 0xffffffff;
          }
        }
      }
      bVar10 = false;
      pcVar7 = (char *)string_local._sizePlusFlags;
      uVar8 = uVar2;
LAB_0013bfc5:
      number = 0;
      bVar1 = false;
    }
    else {
      if (9 < (byte)(c - 0x30U)) {
        if (c == 0x2d) {
          if (number <= local_8c) {
            number = local_8c;
          }
          uVar8 = number;
          if (!bVar1) {
            uVar8 = local_8c;
          }
          goto LAB_0013bfc5;
        }
        Error::Error(&local_58,(Flags)0x0);
        pDVar4 = Debug::operator<<(&local_58.super_Debug,
                                   "Utility::parseNumberSequence(): unrecognized character");
        value_00._sizePlusFlags = 1;
        value_00._data = &c;
        pDVar4 = Debug::operator<<(pDVar4,value_00);
        pDVar4 = Debug::operator<<(pDVar4,"in");
        value._sizePlusFlags = string_local._sizePlusFlags;
        value._data = string_local._data;
        Debug::operator<<(pDVar4,value);
        Error::~Error(&local_58);
        __return_storage_ptr__->_set = false;
        goto LAB_0013c04c;
      }
      uVar5 = (ulong)(byte)(c - 0x30U) + (ulong)number * 10;
      number = (uint32_t)uVar5;
      bVar10 = (bool)(uVar5 >> 0x20 != 0 | bVar10);
      bVar1 = true;
    }
    i = i + 1;
  } while( true );
}

Assistant:

Containers::Optional<Containers::Array<std::uint32_t>> parseNumberSequence(const Containers::StringView string, const std::uint32_t min, const std::uint32_t max) {
    Containers::Array<std::uint32_t> out;

    bool hasNumber = false; /* whether we have a number already */
    std::uint32_t number = 0; /* value of that number */
    bool overflow = false; /* if we've overflown the 32 bits during parsing */
    std::uint32_t rangeStart = ~0u; /* if not ~0u, we're in a range */

    /* Going through one iteration more in order to handle the end-of-string
       condition in the same place as delimiters */
    for(std::size_t i = 0; i <= string.size(); ++i) {
        const char c = i == string.size() ? 0 : string[i];

        /* End of string or a delimiter */
        if(i == string.size() || c == ',' || c == ';' || c == ' ' || c == '\t' || c == '\f' || c == '\v' || c == '\r' || c == '\n') {
            /* If anything has overflown, ignore this piece completely and
               reset the bit again */
            if(overflow) {
                overflow = false;

            /* If we are in a range, fill it. Clamp range end to the soecified
               bounds as well, worst case the loop will not iterate at all. */
            } else if(rangeStart != ~std::uint32_t{}) {
                const std::uint32_t rangeEnd = hasNumber && number < max ? number + 1 : max;

                /* If the range is non-empty, add an uninitialized sequence to
                   the array and then fill it. Should be vastly more efficient
                   for large ranges than arrayAppend() in a loop. */
                if(rangeEnd > rangeStart)
                    for(std::uint32_t& j: arrayAppend(out, NoInit, rangeEnd - rangeStart))
                        j = rangeStart++;
                rangeStart = ~std::uint32_t{};

            /* Otherwise, if we have just one number, save it to the output if
               it's in bounds.*/
            } else if(hasNumber && number >= min && number < max) {
                arrayAppend(out, number);

            /* If we have nothing, there was multiple delimiters after each
               other. */
            }

            hasNumber = false;
            number = 0;

        /* Number */
        } else if(c >= '0' && c <= '9') {
            hasNumber = true;

            /* If there's an overflow, remember that to discard the whole piece
               later. Apparently I can't actually test for overflow with
               `number < next` (huh? why did I think it would work?) so going
               with a bigger type for the multiplication. Answers at
               https://stackoverflow.com/a/1815371 are mostly just crap, using
               a *division* to test if a multiplication overflowed?! */
            const std::uint64_t next = std::uint64_t{number}*10 + (c - '0');
            if(next > ~std::uint32_t{}) overflow = true;

            number = next;

        /* Range specification */
        } else if(c == '-') {
            /* If we have a number, remember it as a range start if it's in
               bounds. Otherwise use the min value. */
            rangeStart = hasNumber && number >= min ? number : min;

            hasNumber = false;
            number = 0;

        /* Something weird, bail */
        } else {
            /** @todo sanitize when Debug::chr / Debug::str is done */
            Error{} << "Utility::parseNumberSequence(): unrecognized character" << Containers::StringView{&c, 1} << "in" << string;
            return {};
        }
    }

    /* GCC 4.8 decases when seeing just `return out` here */
    return Containers::optional(Utility::move(out));
}